

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate.c
# Opt level: O2

void * dsGetIndex(void)

{
  dsCrate *crate;
  void *pvVar1;
  
  crate = getActiveCrate();
  if (crate == (dsCrate *)0x0) {
    dsRunLogCallback("%s(): Can\'t get active crate.\n","dsGetIndex");
  }
  else {
    pvVar1 = mapObject(crate,crate->super->indexObjectOffset,crate->super->indexObjectLength);
    if (pvVar1 != (void *)0x0) {
      return pvVar1;
    }
    dsRunLogCallback("%s(): Can\'t mapObject(,%lu,%lu)\n","dsGetIndex",
                     crate->super->indexObjectOffset,crate->super->indexObjectLength);
  }
  return (void *)0xffffffffffffffff;
}

Assistant:

void *
dsGetIndex()
{
	dsCrate *crate = NULL;
	void *ptr;

	if ((crate = getActiveCrate()) == NULL) {
		dsLog("Can't get active crate.\n");
		return (void *)-1;
	}

	if ((ptr = mapObject(crate, crate->super->indexObjectOffset,
					crate->super->indexObjectLength)) == NULL) {
		dsLog("Can't mapObject(,%" PRIu64 ",%" PRIu64 ")\n",
			crate->super->indexObjectOffset,
			crate->super->indexObjectLength);
		return (void *)-1;
	}

	return ptr;
}